

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPSIO.cpp
# Opt level: O1

int readMPS(char *filename,int mxNumRow,int mxNumCol,int *numRow,int *numCol,int *objSense,
           double *objOffset,vector<int,_std::allocator<int>_> *Astart,
           vector<int,_std::allocator<int>_> *Aindex,vector<double,_std::allocator<double>_> *Avalue
           ,vector<double,_std::allocator<double>_> *colCost,
           vector<double,_std::allocator<double>_> *colLower,
           vector<double,_std::allocator<double>_> *colUpper,
           vector<double,_std::allocator<double>_> *rowLower,
           vector<double,_std::allocator<double>_> *rowUpper,
           vector<int,_std::allocator<int>_> *integerColumn)

{
  uint uVar1;
  pointer piVar2;
  iterator iVar3;
  iterator iVar4;
  pointer pdVar5;
  pointer pdVar6;
  bool bVar7;
  int iVar8;
  FILE *__stream;
  uint *puVar9;
  mapped_type *pmVar10;
  long lVar11;
  vector<double,_std::allocator<double>_> *pvVar12;
  vector<double,_std::allocator<double>_> *pvVar13;
  double dVar14;
  vector<char,_std::allocator<char>_> rowType;
  map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_> rowIndex;
  map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_> colIndex;
  char line [128];
  byte local_1ae [2];
  uint local_1ac;
  double local_1a8;
  double local_1a0;
  double local_198;
  uint *local_190;
  allocator_type local_181;
  double local_180;
  uint *local_178;
  vector<double,_std::allocator<double>_> local_170;
  double local_158;
  int local_14c;
  void *local_148;
  iterator iStack_140;
  char *local_138;
  double local_128;
  value_type_conflict1 local_120;
  _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
  local_118;
  _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
  local_e8;
  char local_b8 [136];
  
  *numRow = 0;
  *numCol = 0;
  *objOffset = 0.0;
  *objSense = 1;
  piVar2 = (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  local_190 = (uint *)numRow;
  local_178 = (uint *)numCol;
  local_14c = mxNumCol;
  printf("readMPS: Trying to open file %s\n",filename);
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    puts("readMPS: Not opened file OK");
    iVar8 = 1;
  }
  else {
    puts("readMPS: Opened file  OK");
    local_1ae[0] = 0;
    local_1ae[1] = 0;
    local_1ac = 0;
    load_mpsLine((FILE *)__stream,(int *)&local_1ac,0x80,local_b8,(char *)local_1ae,&local_1a8);
    load_mpsLine((FILE *)__stream,(int *)&local_1ac,0x80,local_b8,(char *)local_1ae,&local_1a8);
    puts("readMPS: Read NAME    OK");
    local_138 = (char *)0x0;
    local_148 = (void *)0x0;
    iStack_140._M_current = (char *)0x0;
    local_118._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_118._M_impl.super__Rb_tree_header._M_header;
    local_118._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_118._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_118._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_118._M_impl.super__Rb_tree_header._M_header._M_right =
         local_118._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar7 = load_mpsLine((FILE *)__stream,(int *)&local_1ac,0x80,local_b8,(char *)local_1ae,
                         &local_1a8);
    local_180 = 0.0;
    if (bVar7) {
      local_180 = 0.0;
      do {
        if (((local_1ae[0] != 0x4e) || (local_180 != 0.0)) || (NAN(local_180))) {
          if ((0 < mxNumRow) && (mxNumRow <= (int)*local_190)) {
            iVar8 = 2;
            goto LAB_00154377;
          }
          if (iStack_140._M_current == local_138) {
            std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                      ((vector<char,std::allocator<char>> *)&local_148,iStack_140,(char *)local_1ae)
            ;
          }
          else {
            *iStack_140._M_current = local_1ae[0];
            iStack_140._M_current = iStack_140._M_current + 1;
          }
          uVar1 = *local_190;
          *local_190 = uVar1 + 1;
          puVar9 = (uint *)std::
                           map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                           ::operator[]((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                                         *)&local_118,&local_1a0);
          *puVar9 = uVar1;
        }
        else {
          local_180 = local_1a0;
        }
        bVar7 = load_mpsLine((FILE *)__stream,(int *)&local_1ac,0x80,local_b8,(char *)local_1ae,
                             &local_1a8);
      } while (bVar7);
    }
    puts("readMPS: Read ROWS    OK");
    local_e8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_e8._M_impl.super__Rb_tree_header._M_header;
    local_e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_e8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_e8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_e8._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar7 = load_mpsLine((FILE *)__stream,(int *)&local_1ac,0x80,local_b8,(char *)local_1ae,
                         &local_1a8);
    if (bVar7) {
      local_158 = 0.0;
      do {
        local_128 = local_1a0;
        if ((local_158 != local_1a0) || (NAN(local_158) || NAN(local_1a0))) {
          uVar1 = *local_178;
          if (local_14c <= (int)uVar1 && 0 < local_14c) {
            iVar8 = 2;
            goto LAB_0015436a;
          }
          *local_178 = uVar1 + 1;
          puVar9 = (uint *)std::
                           map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                           ::operator[]((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                                         *)&local_e8,&local_1a0);
          *puVar9 = uVar1;
          local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          iVar3._M_current =
               (colCost->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (colCost->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (colCost,iVar3,(double *)&local_170);
          }
          else {
            *iVar3._M_current = 0.0;
            (colCost->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
          iVar8 = (int)((ulong)((long)(Aindex->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_finish -
                               (long)(Aindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                     .super__Vector_impl_data._M_start) >> 2);
          local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_170.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,iVar8);
          iVar4._M_current =
               (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (Astart,iVar4,(int *)&local_170);
          }
          else {
            *iVar4._M_current = iVar8;
            (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar4._M_current + 1;
          }
          iVar4._M_current =
               (integerColumn->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (integerColumn->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)integerColumn,iVar4,(int *)&local_1ac);
            local_158 = local_128;
          }
          else {
            *iVar4._M_current = local_1ac;
            (integerColumn->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar4._M_current + 1;
            local_158 = local_128;
          }
        }
        if ((local_198 != local_180) || (NAN(local_198) || NAN(local_180))) {
          if ((local_1a8 != 0.0) || (NAN(local_1a8))) {
            pmVar10 = std::
                      map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                      ::operator[]((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                                    *)&local_118,&local_198);
            iVar4._M_current =
                 (Aindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (Aindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)Aindex,iVar4,pmVar10);
            }
            else {
              *iVar4._M_current = *pmVar10;
              (Aindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar4._M_current + 1;
            }
            iVar3._M_current =
                 (Avalue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (Avalue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        ((vector<double,std::allocator<double>> *)Avalue,iVar3,&local_1a8);
            }
            else {
              *iVar3._M_current = local_1a8;
              (Avalue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar3._M_current + 1;
            }
          }
        }
        else {
          (colCost->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish[-1] = local_1a8;
        }
        bVar7 = load_mpsLine((FILE *)__stream,(int *)&local_1ac,0x80,local_b8,(char *)local_1ae,
                             &local_1a8);
      } while (bVar7);
    }
    iVar8 = (int)((ulong)((long)(Aindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(Aindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start) >> 2);
    local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(local_170.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,iVar8);
    iVar4._M_current =
         (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar4._M_current ==
        (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(Astart,iVar4,(int *)&local_170)
      ;
    }
    else {
      *iVar4._M_current = iVar8;
      (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar4._M_current + 1;
    }
    puts("readMPS: Read COLUMNS OK");
    local_120 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_170,(long)(int)*local_190,&local_120,&local_181);
    bVar7 = load_mpsLine((FILE *)__stream,(int *)&local_1ac,0x80,local_b8,(char *)local_1ae,
                         &local_1a8);
    if (bVar7) {
      do {
        if ((local_198 != local_180) || (NAN(local_198) || NAN(local_180))) {
          pmVar10 = std::
                    map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                    ::operator[]((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                                  *)&local_118,&local_198);
          local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[*pmVar10] = local_1a8;
        }
        else {
          printf("RHS for N-row in MPS file implies objective offset of %g: ignoring this!\n",
                 local_1a8);
          *objOffset = 0.0;
        }
        bVar7 = load_mpsLine((FILE *)__stream,(int *)&local_1ac,0x80,local_b8,(char *)local_1ae,
                             &local_1a8);
      } while (bVar7);
    }
    puts("readMPS: Read RHS     OK");
    std::vector<double,_std::allocator<double>_>::resize(rowLower,(long)(int)*local_190);
    std::vector<double,_std::allocator<double>_>::resize(rowUpper,(long)(int)*local_190);
    if ((local_1ae[0] == 0x52) &&
       (bVar7 = load_mpsLine((FILE *)__stream,(int *)&local_1ac,0x80,local_b8,(char *)local_1ae,
                             &local_1a8), bVar7)) {
      do {
        pmVar10 = std::
                  map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                  ::operator[]((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                                *)&local_118,&local_198);
        lVar11 = (long)*pmVar10;
        if ((*(char *)((long)local_148 + lVar11) == 'L') ||
           ((*(char *)((long)local_148 + lVar11) == 'E' && (local_1a8 < 0.0)))) {
          dVar14 = local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11] - ABS(local_1a8);
          pvVar12 = rowLower;
          pvVar13 = rowUpper;
        }
        else {
          dVar14 = ABS(local_1a8) +
                   local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11];
          pvVar12 = rowUpper;
          pvVar13 = rowLower;
        }
        (pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar11] = dVar14;
        (pvVar13->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar11] =
             local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar11];
        *(undefined1 *)((long)local_148 + lVar11) = 0x58;
        bVar7 = load_mpsLine((FILE *)__stream,(int *)&local_1ac,0x80,local_b8,(char *)local_1ae,
                             &local_1a8);
      } while (bVar7);
    }
    uVar1 = *local_190;
    if (0 < (long)(int)uVar1) {
      pdVar5 = (rowLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (rowUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar11 = 0;
      do {
        switch(*(undefined1 *)((long)local_148 + lVar11)) {
        case 0x45:
          pdVar5[lVar11] =
               local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar11];
          break;
        default:
          goto switchD_001540b8_caseD_46;
        case 0x47:
          pdVar5[lVar11] =
               local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar11];
          goto LAB_001540e7;
        case 0x4c:
          pdVar5[lVar11] = -1e+200;
          break;
        case 0x4e:
          pdVar5[lVar11] = -1e+200;
LAB_001540e7:
          dVar14 = 1e+200;
          goto LAB_001540eb;
        }
        dVar14 = local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar11];
LAB_001540eb:
        pdVar6[lVar11] = dVar14;
switchD_001540b8_caseD_46:
        lVar11 = lVar11 + 1;
      } while ((int)uVar1 != lVar11);
    }
    puts("readMPS: Read RANGES  OK");
    puVar9 = local_178;
    local_120 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (colLower,(long)(int)*local_178,&local_120);
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (colUpper,(long)(int)*puVar9,(value_type_conflict1 *)&HSOL_CONST_INF);
    if ((local_1ae[0] == 0x42) &&
       (bVar7 = load_mpsLine((FILE *)__stream,(int *)&local_1ac,0x80,local_b8,(char *)local_1ae,
                             &local_1a8), bVar7)) {
      do {
        pmVar10 = std::
                  map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                  ::operator[]((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                                *)&local_e8,&local_198);
        iVar8 = *pmVar10;
        if (local_1ae[0] - 0x49 < 10) {
          iVar8 = (*(code *)(&DAT_0015be08 +
                            *(int *)(&DAT_0015be08 + (ulong)(local_1ae[0] - 0x49) * 4)))();
          return iVar8;
        }
        if (local_1ae[0] == 0x58) {
          (colLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[iVar8] = local_1a8;
          (colUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[iVar8] = local_1a8;
        }
        bVar7 = load_mpsLine((FILE *)__stream,(int *)&local_1ac,0x80,local_b8,(char *)local_1ae,
                             &local_1a8);
      } while (bVar7);
    }
    uVar1 = *local_178;
    if (0 < (long)(int)uVar1) {
      piVar2 = (integerColumn->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (colUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar11 = 0;
      do {
        if (((piVar2[lVar11] != 0) && (dVar14 = pdVar5[lVar11], dVar14 == 1e+200)) && (!NAN(dVar14))
           ) {
          pdVar5[lVar11] = 1.0;
        }
        lVar11 = lVar11 + 1;
      } while ((int)uVar1 != lVar11);
    }
    puts("readMPS: Read BOUNDS  OK");
    puts("readMPS: Read ENDATA  OK");
    printf("readMPS: Model has %d rows and %d columns with %d integer\n",(ulong)*local_190,
           (ulong)*local_178,(ulong)local_1ac);
    fclose(__stream);
    iVar8 = 0;
    if (local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
      iVar8 = 0;
    }
LAB_0015436a:
    std::
    _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
    ::~_Rb_tree(&local_e8);
LAB_00154377:
    std::
    _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
    ::~_Rb_tree(&local_118);
    if (local_148 != (void *)0x0) {
      operator_delete(local_148);
    }
  }
  return iVar8;
}

Assistant:

int readMPS(const char *filename, int mxNumRow, int mxNumCol,
	    int& numRow, int& numCol, int& objSense, double& objOffset,
	    vector<int>& Astart,  vector<int>& Aindex, vector<double>& Avalue,
	    vector<double>& colCost, vector<double>& colLower, vector<double>& colUpper,
	    vector<double>& rowLower, vector<double>& rowUpper,
	    vector<int>& integerColumn) {

    // MPS file buffer
    numRow = 0;
    numCol = 0;
    objOffset = 0;
    objSense = OBJSENSE_MINIMIZE;

    //Astart.clear() added since setting Astart.push_back(0) in
    //setup_clearModel() messes up the MPS read
    Astart.clear();
#ifdef JAJH_dev
    printf("readMPS: Trying to open file %s\n", filename);
#endif
    FILE *file = fopen(filename, "r");
    if (file == 0) {
#ifdef JAJH_dev
      printf("readMPS: Not opened file OK\n");
#endif
      return 1;
    }
#ifdef JAJH_dev
    printf("readMPS: Opened file  OK\n");
#endif
    // Input buffer
    const int lmax = 128;
    char line[lmax];
    char flag[2] = { 0, 0 };
    double data[3];

    int integerCol = 0;

    // Load NAME and ROWS
    load_mpsLine(file, integerCol, lmax, line, flag, data);
    load_mpsLine(file, integerCol, lmax, line, flag, data);
#ifdef JAJH_dev
    printf("readMPS: Read NAME    OK\n");
#endif

    vector<char> rowType;
    map<double, int> rowIndex;
    double objName = 0;
    while (load_mpsLine(file, integerCol, lmax, line, flag, data)) {
      if (flag[0] == 'N' && objName == 0) {
	objName = data[1];
      } else {
	if (mxNumRow>0 && numRow >= mxNumRow) return 2;
	rowType.push_back(flag[0]);
	rowIndex[data[1]] = numRow++;
      }
    }
#ifdef JAJH_dev
    printf("readMPS: Read ROWS    OK\n");
#endif

    // Load COLUMNS
    map<double, int> colIndex;
    double lastName = 0;
    while (load_mpsLine(file, integerCol, lmax, line, flag, data)) {
      if (lastName != data[1]) { // New column
	if (mxNumCol>0 && numCol >= mxNumCol) return 2;
	lastName = data[1];
	colIndex[data[1]] = numCol++;
	colCost.push_back(0);
	Astart.push_back(Aindex.size());
	integerColumn.push_back(integerCol);
      }
      if (data[2] == objName) // Cost
	colCost.back() = data[0];
      else if (data[0] != 0) {
	Aindex.push_back(rowIndex[data[2]]);
	Avalue.push_back(data[0]);
      }
    }
    Astart.push_back(Aindex.size());

#ifdef JAJH_dev
    printf("readMPS: Read COLUMNS OK\n");
#endif

    // Load RHS
    vector<double> RHS(numRow, 0);
    while (load_mpsLine(file, integerCol, lmax, line, flag, data)) {
        if (data[2] != objName) {
            int iRow = rowIndex[data[2]];
            RHS[iRow] = data[0];
        } else {
//        	Strictly, if there is a RHS entry for the N row, it is an objective offset
//        	However, the reported objective values for problems (eg e226) ignore this
#ifdef JAJH_dev
        	printf("RHS for N-row in MPS file implies objective offset of %g: ignoring this!\n", data[0]);
#endif
//            objOffset = data[0]; // Objective offset
            objOffset = 0;
        }
    }
#ifdef JAJH_dev
    printf("readMPS: Read RHS     OK\n");
#endif

    // Load RANGES
    rowLower.resize(numRow);
    rowUpper.resize(numRow);
    if (flag[0] == 'R') {
        while (load_mpsLine(file, integerCol, lmax, line, flag, data)) {
            int iRow = rowIndex[data[2]];
            if (rowType[iRow] == 'L' || (rowType[iRow] == 'E' && data[0] < 0)) {
                rowLower[iRow] = RHS[iRow] - fabs(data[0]);
                rowUpper[iRow] = RHS[iRow];
            } else {
                rowUpper[iRow] = RHS[iRow] + fabs(data[0]);
                rowLower[iRow] = RHS[iRow];
            }
            rowType[iRow] = 'X';
        }
    }

    // Setup bounds for row without 'RANGE'
    for (int iRow = 0; iRow < numRow; iRow++) {
        switch (rowType[iRow]) {
        case 'L':
            rowLower[iRow] = -HSOL_CONST_INF;
            rowUpper[iRow] = RHS[iRow];
            break;
        case 'G':
            rowLower[iRow] = RHS[iRow];
            rowUpper[iRow] = +HSOL_CONST_INF;
            break;
        case 'E':
            rowLower[iRow] = RHS[iRow];
            rowUpper[iRow] = RHS[iRow];
            break;
        case 'N':
            rowLower[iRow] = -HSOL_CONST_INF;
            rowUpper[iRow] = +HSOL_CONST_INF;
            break;
        case 'X':
            break;
        }
    }
#ifdef JAJH_dev
    printf("readMPS: Read RANGES  OK\n");
#endif

    // Load BOUNDS
    colLower.assign(numCol, 0);
    colUpper.assign(numCol, HSOL_CONST_INF);

    if (flag[0] == 'B') {
        while (load_mpsLine(file, integerCol, lmax, line, flag, data)) {
            int iCol = colIndex[data[2]];

            switch (flag[0]) {
            case 'O': /*LO*/
                colLower[iCol] = data[0];
                break;
            case 'I': /*MI*/
                colLower[iCol] = -HSOL_CONST_INF;
                break;
            case 'L': /*PL*/
                colUpper[iCol] = HSOL_CONST_INF;
                break;
            case 'X': /*FX*/
                colLower[iCol] = data[0];
                colUpper[iCol] = data[0];
                break;
            case 'R': /*FR*/
                colLower[iCol] = -HSOL_CONST_INF;
                colUpper[iCol] = HSOL_CONST_INF;
                break;
            case 'P': /*UP*/
                colUpper[iCol] = data[0];
                if (colLower[iCol] == 0 && data[0] < 0)
                    colLower[iCol] = -HSOL_CONST_INF;
                break;
            }
        }
    }

    //bounds of [0,1] for integer variables without bounds
    for (int iCol = 0; iCol < numCol; iCol++) {
      if (integerColumn[iCol]) {
	if (colUpper[iCol] == HSOL_CONST_INF)
	  colUpper[iCol] = 1;
      }
    }

#ifdef JAJH_dev
    printf("readMPS: Read BOUNDS  OK\n");
    printf("readMPS: Read ENDATA  OK\n");
    printf("readMPS: Model has %d rows and %d columns with %d integer\n", numRow, numCol, integerCol);
#endif
    // Load ENDATA and close file
    fclose(file);
    return 0;
}